

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.hpp
# Opt level: O2

array<unsigned_long,_3UL> * __thiscall
mxx::right_shift<std::array<unsigned_long,3ul>>
          (array<unsigned_long,_3UL> *__return_storage_ptr__,mxx *this,array<unsigned_long,_3UL> *t,
          comm *comm)

{
  int iVar1;
  MPI_Request recv_req;
  datatype dt;
  
  dt.mpitype = datatype_builder<std::array<unsigned_long,_3UL>_>::get_type();
  dt._vptr_datatype = (_func_int **)&PTR__datatype_001b4f50;
  dt.builtin = false;
  __return_storage_ptr__->_M_elems[2] = 0;
  __return_storage_ptr__->_M_elems[0] = 0;
  __return_storage_ptr__->_M_elems[1] = 0;
  iVar1 = *(int *)((long)t->_M_elems + 0x14);
  if (0 < iVar1) {
    MPI_Irecv(__return_storage_ptr__,1,dt.mpitype,iVar1 + -1,0xd,t->_M_elems[1],&recv_req);
    iVar1 = *(int *)((long)t->_M_elems + 0x14);
  }
  if (iVar1 < (int)t->_M_elems[2] + -1) {
    MPI_Send(this,1,dt.mpitype,iVar1 + 1,0xd,t->_M_elems[1]);
    iVar1 = *(int *)((long)t->_M_elems + 0x14);
  }
  if (0 < iVar1) {
    MPI_Wait(&recv_req,0);
  }
  datatype::~datatype(&dt);
  return __return_storage_ptr__;
}

Assistant:

T right_shift(const T& t, const mxx::comm& comm = mxx::comm()) {
    // get datatype
    datatype dt = get_datatype<T>();

    // TODO: handle tags with MXX (get unique tag function)
    int tag = 13;

    T left_value = T();
    MPI_Request recv_req;
    // if not last processor
    if (comm.rank() > 0) {
        MPI_Irecv(&left_value, 1, dt.type(), comm.rank()-1, tag,
                  comm, &recv_req);
    }
    // if not first processor
    if (comm.rank() < comm.size()-1) {
        // send my most right element to the right
        MPI_Send(const_cast<T*>(&t), 1, dt.type(), comm.rank()+1, tag, comm);
    }
    if (comm.rank() > 0) {
        // wait for the async receive to finish
        MPI_Wait(&recv_req, MPI_STATUS_IGNORE);
    }
    return left_value;
}